

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_lift(SoPlexBase<double> *this)

{
  SPxLPRational *pSVar1;
  SPxLPBase<double> *pSVar2;
  uint uVar3;
  type_conflict5 tVar4;
  int iVar5;
  Verbosity VVar6;
  int *piVar7;
  uint *puVar8;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  SoPlexBase<double> *in_RDI;
  undefined1 *puVar9;
  longdouble lVar10;
  Verbosity old_verbosity;
  Rational newValue_1;
  int rowIndex_1;
  Rational *value_1;
  int k_1;
  int liftingColumnIndex_1;
  bool addedLiftingRow_1;
  int i_1;
  Rational minValue;
  Rational newValue;
  int rowIndex;
  Rational *value;
  int k;
  int liftingColumnIndex;
  bool addedLiftingRow;
  int i;
  Rational maxValue;
  SVectorRational liftingRowVector;
  Element liftingRowMem [2];
  DSVectorRational colVector;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_false>
  precision_guard_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_false>
  precision_guard;
  undefined4 in_stack_fffffffffffff208;
  undefined4 uVar11;
  int in_stack_fffffffffffff20c;
  fmtflags fVar12;
  undefined2 in_stack_fffffffffffff210;
  undefined2 uVar13;
  undefined6 in_stack_fffffffffffff212;
  undefined4 in_stack_fffffffffffff218;
  int in_stack_fffffffffffff21c;
  LPRowBase<double> *in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff228;
  int in_stack_fffffffffffff22c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff230;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff238;
  undefined1 *puVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff240;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff254;
  type *in_stack_fffffffffffff258;
  longlong *in_stack_fffffffffffff260;
  undefined4 in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff26c;
  undefined8 in_stack_fffffffffffff2c0;
  undefined2 in_stack_fffffffffffff2c8;
  undefined4 in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2dc;
  uint uVar15;
  undefined1 *local_bf8;
  Verbosity local_bf0;
  Verbosity local_bec [3];
  double local_be0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_bd8;
  undefined8 local_b98;
  undefined4 local_b8c;
  undefined1 local_b88 [68];
  uint local_b44;
  Real local_b40;
  Real local_b38 [7];
  undefined8 local_b00;
  undefined1 local_af8 [60];
  undefined4 local_abc;
  undefined1 local_ab8 [76];
  undefined4 local_a6c;
  undefined1 local_a68 [76];
  undefined4 local_a1c;
  undefined1 local_a18 [64];
  undefined1 local_9d8 [236];
  undefined4 local_8ec;
  undefined1 local_8e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  undefined1 local_888 [128];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_808;
  uint local_800;
  uint local_7fc;
  byte local_7f5;
  uint local_7f4;
  Real local_7f0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_7e8;
  double local_7a0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_798;
  undefined8 local_758;
  undefined4 local_74c;
  undefined1 local_748 [68];
  uint local_704;
  Real local_700;
  Real local_6f8 [7];
  undefined8 local_6c0;
  undefined1 local_6b8 [60];
  undefined4 local_67c;
  undefined1 local_678 [76];
  undefined4 local_62c;
  undefined1 local_628 [76];
  undefined4 local_5dc;
  undefined1 local_5d8 [64];
  undefined1 local_598 [236];
  undefined4 local_4ac;
  undefined1 local_4a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [128];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_3c8;
  uint local_3c0;
  uint local_3bc;
  byte local_3b5;
  uint local_3b4;
  Real local_3b0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_3a8;
  undefined1 local_348 [160];
  undefined1 local_2a8 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_2a0 [2];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_280;
  undefined1 *local_278;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_270;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_268;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_260;
  undefined1 *local_258;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_250;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_248;
  undefined8 local_230;
  double *local_228;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_220;
  undefined8 local_208;
  double *local_200;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined4 *local_1c0;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined4 *local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined4 *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined4 *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined4 *local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined4 *local_120;
  undefined1 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 *local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 *local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  undefined4 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  double *local_60;
  double *local_58;
  expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,false>
  local_39;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_38;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_30;
  expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_20;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,false>
  local_11;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_10;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_8;
  
  SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[42],_0>
            (in_RDI,(char (*) [42])"Reducing matrix coefficients by lifting.\n");
  (*in_RDI->_statistics->transformTime->_vptr_Timer[3])();
  iVar5 = numColsRational((SoPlexBase<double> *)0x42582e);
  in_RDI->_beforeLiftCols = iVar5;
  iVar5 = numRowsRational((SoPlexBase<double> *)0x425841);
  in_RDI->_beforeLiftRows = iVar5;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff220,in_stack_fffffffffffff21c);
  local_bf8 = local_348;
  do {
    Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff20c,in_stack_fffffffffffff208));
    local_bf8 = local_bf8 + 0x50;
  } while (local_bf8 != local_2a8);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SVectorBase((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT62(in_stack_fffffffffffff212,in_stack_fffffffffffff210),
                in_stack_fffffffffffff20c,
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)0x4258df);
  local_3b0 = realParam(in_RDI,LIFTMAXVAL);
  local_220 = &local_3a8;
  local_228 = &local_3b0;
  local_230 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x42593d);
  local_58 = local_228;
  lVar10 = (longdouble)*local_228;
  uVar11 = SUB104(lVar10,0);
  fVar12 = (fmtflags)((unkuint10)lVar10 >> 0x20);
  uVar13 = (undefined2)((unkuint10)lVar10 >> 0x40);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
              (longdouble)CONCAT28(in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0));
  for (local_3b4 = 0; uVar3 = local_3b4, iVar5 = numColsRational((SoPlexBase<double> *)0x4259d9),
      (int)uVar3 < iVar5; local_3b4 = local_3b4 + 1) {
    SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[33],_int_&,_0>
              (in_RDI,(char (*) [33])"in lifting: examining column {}\n",(int *)&local_3b4);
    colVectorRational((SoPlexBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT44(fVar12,uVar11));
    local_3b5 = 0;
    local_3bc = 0xffffffff;
    local_3c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::size(local_2a0);
    while (local_3c0 = local_3c0 - 1, -1 < (int)local_3c0) {
      local_3c8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::value(local_2a0,local_3c0);
      local_278 = local_448;
      local_280 = local_3c8;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)in_stack_fffffffffffff220,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(fVar12,uVar11),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x425b08);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x425b1e);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x425b2b);
      if (tVar4) {
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                         CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
        piVar7 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ::index(local_2a0,(char *)(ulong)local_3c0,__c);
        SPxOut::
        debug<soplex::SoPlexBase<double>,_const_char_(&)[42],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&,_0>
                  (in_RDI,(char (*) [42])"   --> nonzero {} has value {} in row {}\n",
                   (int *)&local_3c0,&local_468,piVar7);
        std::__cxx11::string::~string((string *)&local_468);
        iVar5 = extraout_EDX;
        if ((local_3b5 & 1) == 0) {
          SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[36],_0>
                    (in_RDI,(char (*) [36])"            --> adding lifting row\n");
          local_3bc = numColsRational((SoPlexBase<double> *)0x425bd1);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)in_stack_fffffffffffff220);
          local_4ac = 0xffffffff;
          local_1d8 = local_4a8;
          local_1e0 = &local_4ac;
          local_1e8 = 0;
          local_1f0 = 0xffffffffffffffff;
          local_68 = local_1e0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)in_stack_fffffffffffff220);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x425cb6);
          pSVar1 = in_RDI->_rationalLP;
          local_5dc = 0;
          local_1b8 = local_5d8;
          local_1c0 = &local_5dc;
          local_1c8 = 0;
          local_1d0 = 0;
          local_70 = local_1c0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          local_62c = 0;
          local_198 = local_628;
          local_1a0 = &local_62c;
          local_1a8 = 0;
          local_1b0 = 0;
          local_78 = local_1a0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          local_67c = 0;
          local_178 = local_678;
          local_180 = &local_67c;
          local_188 = 0;
          local_190 = 0;
          local_80 = local_180;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                      (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)in_stack_fffffffffffff230);
          (*(pSVar1->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[5])(pSVar1,local_598,0);
          LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)CONCAT62(in_stack_fffffffffffff212,uVar13));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x425e98);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x425ea5);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x425eb2);
          pSVar2 = in_RDI->_realLP;
          local_6c0 = 0;
          DSVectorBase<double>::
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                    ((DSVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(fVar12,uVar11));
          local_6f8[2] = 0.0;
          local_6f8[1] = 0.0;
          LPRowBase<double>::LPRowBase
                    (in_stack_fffffffffffff220,
                     (double *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                     (SVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                     (double *)CONCAT44(fVar12,uVar11),(double *)0x425f31);
          (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[5])(pSVar2,local_6b8,0);
          LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x425f5d);
          DSVectorBase<double>::~DSVectorBase
                    ((DSVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13));
          (*(in_RDI->_rationalLP->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x30])
                    (in_RDI->_rationalLP,(ulong)local_3bc,&in_RDI->_rationalNegInfty,
                     &in_RDI->_rationalPosInfty,0);
          uVar3 = local_3bc;
          pSVar2 = in_RDI->_realLP;
          local_6f8[0] = realParam(in_RDI,INFTY);
          local_6f8[0] = -local_6f8[0];
          local_700 = realParam(in_RDI,INFTY);
          (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x30])
                    (pSVar2,(ulong)uVar3,local_6f8,&local_700,0);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x426040);
          local_3b5 = 1;
          iVar5 = extraout_EDX_00;
        }
        puVar8 = (uint *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ::index(local_2a0,(char *)(ulong)local_3c0,iVar5);
        local_704 = *puVar8;
        SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[33],_0>
                  (in_RDI,(char (*) [33])"            --> changing matrix\n");
        uVar15 = local_3b4;
        uVar3 = local_704;
        pSVar1 = in_RDI->_rationalLP;
        local_74c = 0;
        local_158 = local_748;
        local_160 = &local_74c;
        local_168 = 0;
        local_170 = 0;
        local_88 = local_160;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                   in_stack_fffffffffffff260,in_stack_fffffffffffff258);
        (*(pSVar1->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x43])(pSVar1,(ulong)uVar3,(ulong)uVar15,local_748,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x4263b1);
        local_758 = 0;
        (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (in_RDI->_realLP,(ulong)local_704,(ulong)local_3b4,&local_758,0);
        local_268 = &local_798;
        local_270 = local_3c8;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)in_stack_fffffffffffff220,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
        local_8 = &local_798;
        local_10 = &local_3a8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                  (&local_11,local_8,local_10);
        boost::multiprecision::detail::
        expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
        ::expression(&local_20,local_10);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                   (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                    *)CONCAT62(in_stack_fffffffffffff212,uVar13),(terminal *)CONCAT44(fVar12,uVar11)
                  );
        (*(in_RDI->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x43])
                  (in_RDI->_rationalLP,(ulong)local_704,(ulong)local_3bc,&local_798,0);
        uVar15 = local_3bc;
        uVar3 = local_704;
        pSVar2 = in_RDI->_realLP;
        local_7a0 = boost::multiprecision::number::operator_cast_to_double
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x426525);
        (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (pSVar2,(ulong)uVar3,(ulong)uVar15,&local_7a0,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x42657e);
      }
    }
  }
  local_7f0 = realParam(in_RDI,LIFTMINVAL);
  local_1f8 = &local_7e8;
  local_200 = &local_7f0;
  local_208 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x426658);
  local_60 = local_200;
  lVar10 = (longdouble)*local_200;
  uVar11 = SUB104(lVar10,0);
  fVar12 = (fmtflags)((unkuint10)lVar10 >> 0x20);
  uVar13 = (undefined2)((unkuint10)lVar10 >> 0x40);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
               *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
              (longdouble)CONCAT28(in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0));
  for (local_7f4 = 0; uVar3 = local_7f4, iVar5 = numColsRational((SoPlexBase<double> *)0x4266f4),
      (int)uVar3 < iVar5; local_7f4 = local_7f4 + 1) {
    SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[33],_int_&,_0>
              (in_RDI,(char (*) [33])"in lifting: examining column {}\n",(int *)&local_7f4);
    colVectorRational((SoPlexBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT44(fVar12,uVar11));
    local_7f5 = 0;
    local_7fc = 0xffffffff;
    local_800 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                ::size(local_2a0);
    while (local_800 = local_800 - 1, -1 < (int)local_800) {
      local_808 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::value(local_2a0,local_800);
      local_258 = local_888;
      local_260 = local_808;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)in_stack_fffffffffffff220,
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(fVar12,uVar11),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)0x426823);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x426839);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x426846);
      if (tVar4) {
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                         CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
        piVar7 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ::index(local_2a0,(char *)(ulong)local_800,__c_00);
        SPxOut::
        debug<soplex::SoPlexBase<double>,_const_char_(&)[42],_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_&,_0>
                  (in_RDI,(char (*) [42])"   --> nonzero {} has value {} in row {}\n",
                   (int *)&local_800,&local_8a8,piVar7);
        std::__cxx11::string::~string((string *)&local_8a8);
        iVar5 = extraout_EDX_01;
        if ((local_7f5 & 1) == 0) {
          SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[36],_0>
                    (in_RDI,(char (*) [36])"            --> adding lifting row\n");
          local_7fc = numColsRational((SoPlexBase<double> *)0x4268ec);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)in_stack_fffffffffffff220);
          local_8ec = 0xffffffff;
          local_138 = local_8e8;
          local_140 = &local_8ec;
          local_148 = 0;
          local_150 = 0xffffffffffffffff;
          local_90 = local_140;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::add(in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)in_stack_fffffffffffff220);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x4269d1);
          pSVar1 = in_RDI->_rationalLP;
          local_a1c = 0;
          local_118 = local_a18;
          local_120 = &local_a1c;
          local_128 = 0;
          local_130 = 0;
          local_98 = local_120;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          local_a6c = 0;
          local_f8 = local_a68;
          local_100 = &local_a6c;
          local_108 = 0;
          local_110 = 0;
          local_a0 = local_100;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          local_abc = 0;
          local_d8 = local_ab8;
          local_e0 = &local_abc;
          local_e8 = 0;
          local_f0 = 0;
          local_a8 = local_e0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                     in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                      in_stack_fffffffffffff248,in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                      (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)in_stack_fffffffffffff230);
          (*(pSVar1->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[5])(pSVar1,local_9d8,0);
          LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)CONCAT62(in_stack_fffffffffffff212,uVar13));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x426bb3);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x426bc0);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x426bcd);
          pSVar2 = in_RDI->_realLP;
          local_b00 = 0;
          DSVectorBase<double>::
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                    ((DSVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)CONCAT44(fVar12,uVar11));
          local_b38[2] = 0.0;
          local_b38[1] = 0.0;
          LPRowBase<double>::LPRowBase
                    (in_stack_fffffffffffff220,
                     (double *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                     (SVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                     (double *)CONCAT44(fVar12,uVar11),(double *)0x426c4c);
          (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[5])(pSVar2,local_af8,0);
          LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x426c78);
          DSVectorBase<double>::~DSVectorBase
                    ((DSVectorBase<double> *)CONCAT62(in_stack_fffffffffffff212,uVar13));
          (*(in_RDI->_rationalLP->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._vptr_ClassArray[0x30])
                    (in_RDI->_rationalLP,(ulong)local_7fc,&in_RDI->_rationalNegInfty,
                     &in_RDI->_rationalPosInfty,0);
          uVar3 = local_7fc;
          pSVar2 = in_RDI->_realLP;
          local_b38[0] = realParam(in_RDI,INFTY);
          local_b38[0] = -local_b38[0];
          local_b40 = realParam(in_RDI,INFTY);
          (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x30])
                    (pSVar2,(ulong)uVar3,local_b38,&local_b40,0);
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x426d5b);
          local_7f5 = 1;
          iVar5 = extraout_EDX_02;
        }
        puVar8 = (uint *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ::index(local_2a0,(char *)(ulong)local_800,iVar5);
        local_b44 = *puVar8;
        SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[33],_0>
                  (in_RDI,(char (*) [33])"            --> changing matrix\n");
        uVar3 = local_7f4;
        pSVar1 = in_RDI->_rationalLP;
        local_b8c = 0;
        local_b8 = local_b88;
        local_c0 = &local_b8c;
        local_c8 = 0;
        local_d0 = 0;
        uVar15 = local_b44;
        local_b0 = local_c0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
                   in_stack_fffffffffffff260,in_stack_fffffffffffff258);
        (*(pSVar1->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x43])(pSVar1,(ulong)uVar15,(ulong)uVar3,local_b88,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x427009);
        local_b98 = 0;
        (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (in_RDI->_realLP,(ulong)local_b44,(ulong)local_7f4,&local_b98,0);
        local_248 = &local_bd8;
        local_250 = local_808;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)in_stack_fffffffffffff220,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218));
        local_30 = &local_bd8;
        local_38 = &local_7e8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                  (&local_39,local_30,local_38);
        boost::multiprecision::detail::
        expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
        ::expression(&local_48,local_38);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        do_divide<boost::multiprecision::detail::expression<boost::multiprecision::detail::terminal,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void,void>>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                   (expression<boost::multiprecision::detail::terminal,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                    *)CONCAT62(in_stack_fffffffffffff212,uVar13),(terminal *)CONCAT44(fVar12,uVar11)
                  );
        (*(in_RDI->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x43])
                  (in_RDI->_rationalLP,(ulong)local_b44,(ulong)local_7fc,&local_bd8,0);
        uVar15 = local_7fc;
        uVar3 = local_b44;
        pSVar2 = in_RDI->_realLP;
        local_be0 = boost::multiprecision::number::operator_cast_to_double
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)0x42717d);
        (*(pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (pSVar2,(ulong)uVar3,(ulong)uVar15,&local_be0,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x4271d6);
      }
    }
  }
  if ((in_RDI->_hasBasis & 1U) != 0) {
    numColsRational((SoPlexBase<double> *)0x427287);
    local_bec[2] = 4;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12,(VarStatus *)0x4272c7);
    numRowsRational((SoPlexBase<double> *)0x4272e7);
    local_bec[1] = 2;
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12,(VarStatus *)0x427327);
    SLUFactorRational::clear((SLUFactorRational *)CONCAT62(in_stack_fffffffffffff212,uVar13));
  }
  (*in_RDI->_statistics->transformTime->_vptr_Timer[4])();
  iVar5 = numColsRational((SoPlexBase<double> *)0x427369);
  if ((((in_RDI->_beforeLiftCols < iVar5) ||
       (iVar5 = numRowsRational((SoPlexBase<double> *)0x427390), in_RDI->_beforeLiftRows < iVar5))
      && (in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8)) &&
     (VVar6 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar6)) {
    local_bec[0] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_bf0 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_bf0);
    soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                       (char *)CONCAT44(fVar12,uVar11));
    numColsRational((SoPlexBase<double> *)0x427443);
    soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
    soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                       (char *)CONCAT44(fVar12,uVar11));
    numRowsRational((SoPlexBase<double> *)0x427493);
    soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffff212,uVar13),fVar12);
    soplex::operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffff212,uVar13),
                       (char *)CONCAT44(fVar12,uVar11));
    SPxOut::setVerbosity(&in_RDI->spxout,local_bec);
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x4274fb);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x427508);
  puVar14 = local_348;
  puVar9 = local_2a8;
  do {
    puVar9 = puVar9 + -0x50;
    Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x427533);
  } while (puVar9 != puVar14);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)CONCAT62(in_stack_fffffffffffff212,uVar13));
  return;
}

Assistant:

void SoPlexBase<R>::_lift()
{
   SPxOut::debug(this, "Reducing matrix coefficients by lifting.\n");

   // start timing
   _statistics->transformTime->start();

   SPX_DEBUG(_realLP->writeFileLPBase("beforeLift.lp", 0, 0, 0));

   // remember unlifted state
   _beforeLiftCols = numColsRational();
   _beforeLiftRows = numRowsRational();

   // allocate vector memory
   DSVectorRational colVector;
   SVectorRational::Element liftingRowMem[2];
   SVectorRational liftingRowVector(2, liftingRowMem);

   // search each column for large nonzeros entries
   // @todo: rethink about the static_cast TODO
   const Rational maxValue = static_cast<Rational>(realParam(SoPlexBase<R>::LIFTMAXVAL));

   for(int i = 0; i < numColsRational(); i++)
   {
      SPxOut::debug(this, "in lifting: examining column {}\n", i);

      // get column vector
      colVector = colVectorRational(i);

      bool addedLiftingRow = false;
      int liftingColumnIndex = -1;

      // go through nonzero entries of the column
      for(int k = colVector.size() - 1; k >= 0; k--)
      {
         const Rational& value = colVector.value(k);

         if(spxAbs(value) > maxValue)
         {
            SPxOut::debug(this, "   --> nonzero {} has value {} in row {}\n", k, value.str(),
                          colVector.index(k));

            // add new column equal to maxValue times original column
            if(!addedLiftingRow)
            {
               SPxOut::debug(this, "            --> adding lifting row\n");

               assert(liftingRowVector.size() == 0);

               liftingColumnIndex = numColsRational();
               liftingRowVector.add(i, maxValue);
               liftingRowVector.add(liftingColumnIndex, -1);

               _rationalLP->addRow(LPRowRational(0, liftingRowVector, 0));
               _realLP->addRow(LPRowBase<R>(0.0, DSVectorBase<R>(liftingRowVector), 0.0));

               assert(liftingColumnIndex == numColsRational() - 1);
               assert(liftingColumnIndex == numCols() - 1);

               _rationalLP->changeBounds(liftingColumnIndex, _rationalNegInfty, _rationalPosInfty);
               _realLP->changeBounds(liftingColumnIndex, -realParam(SoPlexBase<R>::INFTY),
                                     realParam(SoPlexBase<R>::INFTY));

               liftingRowVector.clear();
               addedLiftingRow = true;
            }

            // get row index
            int rowIndex = colVector.index(k);
            assert(rowIndex >= 0);
            assert(rowIndex < _beforeLiftRows);
            assert(liftingColumnIndex == numColsRational() - 1);

            SPxOut::debug(this, "            --> changing matrix\n");

            // remove nonzero from original column
            _rationalLP->changeElement(rowIndex, i, 0);
            _realLP->changeElement(rowIndex, i, 0.0);

            // add nonzero divided by maxValue to new column
            Rational newValue(value);
            newValue /= maxValue;
            _rationalLP->changeElement(rowIndex, liftingColumnIndex, newValue);
            _realLP->changeElement(rowIndex, liftingColumnIndex, R(newValue));
         }
      }
   }

   // search each column for small nonzeros entries
   const Rational minValue = Rational(realParam(SoPlexBase<R>::LIFTMINVAL));

   for(int i = 0; i < numColsRational(); i++)
   {
      SPxOut::debug(this, "in lifting: examining column {}\n", i);

      // get column vector
      colVector = colVectorRational(i);

      bool addedLiftingRow = false;
      int liftingColumnIndex = -1;

      // go through nonzero entries of the column
      for(int k = colVector.size() - 1; k >= 0; k--)
      {
         const Rational& value = colVector.value(k);

         if(spxAbs(value) < minValue)
         {
            SPxOut::debug(this, "   --> nonzero {} has value {} in row {}\n", k, value.str(),
                          colVector.index(k));

            // add new column equal to maxValue times original column
            if(!addedLiftingRow)
            {
               SPxOut::debug(this, "            --> adding lifting row\n");

               assert(liftingRowVector.size() == 0);

               liftingColumnIndex = numColsRational();
               liftingRowVector.add(i, minValue);
               liftingRowVector.add(liftingColumnIndex, -1);

               _rationalLP->addRow(LPRowRational(0, liftingRowVector, 0));
               _realLP->addRow(LPRowBase<R>(0.0, DSVectorBase<R>(liftingRowVector), 0.0));

               assert(liftingColumnIndex == numColsRational() - 1);
               assert(liftingColumnIndex == numCols() - 1);

               _rationalLP->changeBounds(liftingColumnIndex, _rationalNegInfty, _rationalPosInfty);
               _realLP->changeBounds(liftingColumnIndex, -realParam(SoPlexBase<R>::INFTY),
                                     realParam(SoPlexBase<R>::INFTY));

               liftingRowVector.clear();
               addedLiftingRow = true;
            }

            // get row index
            int rowIndex = colVector.index(k);
            assert(rowIndex >= 0);
            assert(rowIndex < _beforeLiftRows);
            assert(liftingColumnIndex == numColsRational() - 1);

            SPxOut::debug(this, "            --> changing matrix\n");

            // remove nonzero from original column
            _rationalLP->changeElement(rowIndex, i, 0);
            _realLP->changeElement(rowIndex, i, 0.0);

            // add nonzero divided by maxValue to new column
            Rational newValue(value);
            newValue /= minValue;
            _rationalLP->changeElement(rowIndex, liftingColumnIndex, newValue);
            _realLP->changeElement(rowIndex, liftingColumnIndex, R(newValue));
         }
      }
   }

   // adjust basis
   if(_hasBasis)
   {
      assert(numColsRational() >= _beforeLiftCols);
      assert(numRowsRational() >= _beforeLiftRows);

      _basisStatusCols.append(numColsRational() - _beforeLiftCols, SPxSolverBase<R>::BASIC);
      _basisStatusRows.append(numRowsRational() - _beforeLiftRows, SPxSolverBase<R>::FIXED);
      _rationalLUSolver.clear();
   }

   SPX_DEBUG(_realLP->writeFileLPBase("afterLift.lp", 0, 0, 0));

   // stop timing
   _statistics->transformTime->stop();

   if(numColsRational() > _beforeLiftCols || numRowsRational() > _beforeLiftRows)
   {
      SPX_MSG_INFO1(spxout, spxout << "Added " << numColsRational() - _beforeLiftCols << " columns and "
                    << numRowsRational() - _beforeLiftRows << " rows to reduce large matrix coefficients\n.");
   }
}